

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_writer.c
# Opt level: O3

int dlep_writer_map_l2net_data(dlep_writer *writer,dlep_extension *ext,oonf_layer2_data *data)

{
  uint uVar1;
  dlep_network_mapping *pdVar2;
  code *pcVar3;
  int iVar4;
  undefined8 uVar5;
  ulong uVar6;
  long lVar7;
  
  if (ext->if_mapping_count != 0) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      pdVar2 = ext->if_mapping;
      pcVar3 = *(code **)((long)&pdVar2->to_tlv + lVar7);
      uVar1 = *(uint *)((long)&pdVar2->layer2 + lVar7);
      uVar5 = oonf_layer2_net_metadata_get();
      iVar4 = (*pcVar3)(writer,data + uVar1,uVar5,*(undefined2 *)((long)&pdVar2->dlep + lVar7),
                        *(undefined2 *)((long)&pdVar2->length + lVar7),
                        *(undefined8 *)((long)&pdVar2->scaling + lVar7));
      if (iVar4 != 0) {
        return ~(uint)uVar6;
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x40;
    } while (uVar6 < ext->if_mapping_count);
  }
  return 0;
}

Assistant:

int
dlep_writer_map_l2net_data(struct dlep_writer *writer, struct dlep_extension *ext, struct oonf_layer2_data *data) {
  struct dlep_network_mapping *map;
  size_t i;

  for (i = 0; i < ext->if_mapping_count; i++) {
    map = &ext->if_mapping[i];

    if (map->to_tlv(writer, &data[map->layer2], oonf_layer2_net_metadata_get(map->layer2), map->dlep, map->length, map->scaling)) {
      return -(i + 1);
    }
  }
  return 0;
}